

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2Runner.hpp
# Opt level: O1

int __thiscall Centaurus::Stage2Runner::parse_subtree(Stage2Runner *this,uint64_t *ast,int position)

{
  pointer puVar1;
  iterator __position;
  atomic<int> *paVar2;
  bool bVar3;
  int position_00;
  ulong uVar4;
  uint64_t uVar5;
  SimpleException *this_00;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int unaff_R13D;
  uint64_t *puVar11;
  SymbolEntry sym;
  int local_a8;
  string local_50;
  
  iVar9 = position + 1;
  uVar8 = (ulong)iVar9;
  position_00 = iVar9;
  if (uVar8 < (this->super_BaseRunner).m_bank_size >> 3) {
    lVar6 = (long)position;
    uVar4 = (ast + lVar6 + 1)[-1] & 0xffffffffffff;
    local_a8 = iVar9;
    do {
      uVar7 = ast[uVar8];
      if (uVar7 == 0) {
        this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Null entry in CST window.","");
        SimpleException::SimpleException(this_00,&local_50);
        __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
      }
      if ((uVar7 & 0x7fff000000000000) == 0 || -1 < (long)uVar7) {
        bVar3 = true;
        if (-1 < (long)uVar7 && (uVar7 & 0x7fff000000000000) != 0) {
          puVar1 = (this->val_stack).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish != puVar1) {
            (this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar1;
          }
          if (iVar9 < local_a8) {
            lVar10 = lVar6 + 1;
            puVar11 = ast + lVar6 + 2;
            do {
              __position._M_current =
                   (this->val_stack).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->val_stack).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->val_stack,
                           __position,puVar11);
              }
              else {
                *__position._M_current = *puVar11;
                (this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              lVar10 = lVar10 + 2;
              puVar11 = puVar11 + 2;
            } while (lVar10 < local_a8);
          }
          local_50._M_dataplus._M_p = (pointer)(uVar7 >> 0x30);
          uVar7 = uVar7 & 0xffffffffffff;
          local_50._M_string_length = uVar4;
          local_50.field_2._M_allocated_capacity = uVar7;
          if (this->m_listener == (ReductionListener)0x0) {
            uVar5 = 0;
          }
          else {
            puVar11 = (this->val_stack).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar5 = (*this->m_listener)((SymbolEntry *)&local_50,puVar11,
                                        (int)((ulong)((long)(this->val_stack).
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)puVar11) >> 3),this->m_listener_context);
          }
          paVar2 = this->reduction_counter;
          if (paVar2 != (atomic<int> *)0x0) {
            LOCK();
            *(int *)paVar2 = *(int *)paVar2 + 1;
            UNLOCK();
          }
          if (iVar9 < local_a8) {
            memset(ast + lVar6 + 1,0,(ulong)((local_a8 - position) - 2) * 8 + 8);
          }
          ast[uVar8] = 0;
          ast[lVar6] = uVar7 | 0x8000000000000000;
          ast[iVar9] = uVar5;
          bVar3 = false;
          unaff_R13D = position_00;
        }
      }
      else {
        position_00 = parse_subtree(this,ast,position_00);
        bVar3 = true;
        if ((ulong)(long)position_00 < (this->super_BaseRunner).m_bank_size >> 3) {
          uVar5 = ast[uVar8];
          ast[uVar8] = 0;
          ast[local_a8] = uVar5;
          uVar5 = ast[uVar8 + 1];
          ast[uVar8 + 1] = 0;
          ast[(long)local_a8 + 1] = uVar5;
          local_a8 = local_a8 + 2;
        }
      }
      if (!bVar3) {
        return unaff_R13D;
      }
      position_00 = position_00 + 1;
      uVar8 = (ulong)position_00;
    } while (uVar8 < (this->super_BaseRunner).m_bank_size >> 3);
  }
  return position_00;
}

Assistant:

int parse_subtree(uint64_t *ast, int position)
  {
    CSTMarker start_marker(ast[position]);
    int i, j;
    j = position + 1;
    for (i = position + 1; i < m_bank_size / 8; i++) {
      if (ast[i] == 0) {
        throw SimpleException("Null entry in CST window.");
      }
      CSTMarker marker(ast[i]);
      if (marker.is_start_marker()) {
        int k = parse_subtree(ast, i);
        if (k < m_bank_size / 8) {
          uint64_t subtree_sv[2];
          subtree_sv[0] = ast[i];
          ast[i] = 0;
          ast[j] = subtree_sv[0];
          subtree_sv[1] = ast[i + 1];
          ast[i + 1] = 0;
          ast[j + 1] = subtree_sv[1];
          j += 2;
        }
        i = k;
      } else if (marker.is_end_marker()) {
        val_stack.clear();
        for (int l = position + 1; l < j; l += 2) {
          val_stack.emplace_back(ast[l + 1]);
        }
        long tag = 0;
        SymbolEntry sym(marker.get_machine_id(), start_marker.get_offset(), marker.get_offset());
        if (m_listener != nullptr)
          tag = m_listener(&sym, val_stack.data(), val_stack.size(), m_listener_context);
        if (reduction_counter != nullptr) {
          (*reduction_counter)++;
        }
        //Zero-fill the SV list
        for (int k = position + 1; k < j; k++) {
          ast[k] = 0;
        }
        //Zero-fill the end marker
        ast[i] = 0;
        ast[position] = ((uint64_t)1 << 63) | marker.get_offset();
        ast[position + 1] = tag;
        return i;
      }
    }
    return i;
  }